

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data.c
# Opt level: O1

lyd_attr * lyd_insert_attr(lyd_node *parent,lys_module *mod,char *name,char *value)

{
  lys_node *plVar1;
  lys_module *plVar2;
  lyd_attr *plVar3;
  int iVar4;
  char *pcVar5;
  char *name_00;
  lyd_attr *attr;
  undefined8 *puVar6;
  lys_type *plVar7;
  lyd_attr *plVar8;
  LY_ERR no;
  uint uVar9;
  int iVar10;
  ly_ctx *ctx;
  
  if ((name == (char *)0x0 || parent == (lyd_node *)0x0) || value == (char *)0x0) {
    pcVar5 = "Invalid arguments (%s()).";
    ctx = (ly_ctx *)0x0;
    no = LY_EINVAL;
    goto LAB_0016e99d;
  }
  plVar1 = parent->schema;
  plVar2 = plVar1->module;
  ctx = plVar2->ctx;
  pcVar5 = strchr(name,0x3a);
  if (pcVar5 == (char *)0x0) {
    if (mod == (lys_module *)0x0) {
      iVar10 = strcmp(name,"type");
      if (((iVar10 == 0) || (iVar10 = strcmp(name,"select"), iVar10 == 0)) &&
         (iVar10 = strcmp(plVar1->name,"filter"), iVar10 == 0)) {
        mod = ly_ctx_get_module(ctx,"ietf-netconf",(char *)0x0,1);
        if (mod == (lys_module *)0x0) {
          pcVar5 = "Attribute prefix does not match any implemented schema in the context.";
          goto LAB_0016e9c2;
        }
      }
      else {
        mod = plVar2;
        if ((plVar2->field_0x40 & 1) != 0) {
          mod = (lys_module *)plVar2->data;
        }
      }
    }
LAB_0016e848:
    iVar10 = -1;
    do {
      uVar9 = iVar10 + 1;
      iVar10 = -1;
      if (uVar9 < mod->ext_size) {
        iVar4 = lys_ext_instance_presence
                          ((*(ctx->models).list)->extensions,mod->ext + uVar9,
                           mod->ext_size - (char)uVar9);
        iVar10 = uVar9 + iVar4;
        if (iVar4 == -1) {
          iVar10 = -1;
        }
      }
      if (iVar10 == -1) {
        pcVar5 = "Attribute does not match any annotation instance definition.";
        goto LAB_0016e9c2;
      }
      iVar4 = ly_strequal_(mod->ext[iVar10]->arg_value,name);
    } while (iVar4 == 0);
    attr = (lyd_attr *)calloc(1,0x38);
    if (attr != (lyd_attr *)0x0) {
      attr->parent = parent;
      attr->next = (lyd_attr *)0x0;
      attr->annotation = (lys_ext_instance_complex *)mod->ext[iVar10];
      pcVar5 = lydict_insert(ctx,name,0);
      attr->name = pcVar5;
      pcVar5 = lydict_insert(ctx,value,0);
      attr->value_str = pcVar5;
      puVar6 = (undefined8 *)
               lys_ext_complex_get_substmt(LY_STMT_TYPE,attr->annotation,(lyext_substmt **)0x0);
      plVar7 = lyp_parse_value((lys_type *)*puVar6,&attr->value_str,(lyxml_elem *)0x0,
                               (lyd_node_leaf_list *)0x0,attr,(lys_module *)0x0,1,0,0);
      if (plVar7 == (lys_type *)0x0) {
        lyd_free_attr(ctx,(lyd_node *)0x0,attr,0);
        return (lyd_attr *)0x0;
      }
      plVar3 = parent->attr;
      if (parent->attr != (lyd_attr *)0x0) {
        do {
          plVar8 = plVar3;
          plVar3 = plVar8->next;
        } while (plVar3 != (lyd_attr *)0x0);
        plVar8->next = attr;
        return attr;
      }
      parent->attr = attr;
      return attr;
    }
  }
  else {
    name_00 = strndup(name,(long)pcVar5 - (long)name);
    if (name_00 != (char *)0x0) {
      mod = ly_ctx_get_module(ctx,name_00,(char *)0x0,1);
      free(name_00);
      if (mod == (lys_module *)0x0) {
        pcVar5 = "Attribute prefix does not match any implemented schema in the context.";
LAB_0016e9c2:
        ly_log(ctx,LY_LLERR,LY_EINVAL,pcVar5);
        return (lyd_attr *)0x0;
      }
      name = pcVar5 + 1;
      goto LAB_0016e848;
    }
  }
  pcVar5 = "Memory allocation failed (%s()).";
  no = LY_EMEM;
LAB_0016e99d:
  ly_log(ctx,LY_LLERR,no,pcVar5,"lyd_insert_attr");
  return (lyd_attr *)0x0;
}

Assistant:

lyd_attr *
lyd_insert_attr(struct lyd_node *parent, const struct lys_module *mod, const char *name, const char *value)
{
    struct lyd_attr *a, *iter;
    struct ly_ctx *ctx;
    const struct lys_module *module;
    const char *p;
    char *aux;
    int pos, i;

    if (!parent || !name || !value) {
        LOGARG;
        return NULL;
    }
    ctx = parent->schema->module->ctx;

    if ((p = strchr(name, ':'))) {
        /* search for the namespace */
        aux = strndup(name, p - name);
        if (!aux) {
            LOGMEM(ctx);
            return NULL;
        }
        module = ly_ctx_get_module(ctx, aux, NULL, 1);
        free(aux);
        name = p + 1;

        if (!module) {
            /* module not found */
            LOGERR(ctx, LY_EINVAL, "Attribute prefix does not match any implemented schema in the context.");
            return NULL;
        }
    } else if (mod) {
        module = mod;
    } else if (!mod && (!strcmp(name, "type") || !strcmp(name, "select")) && !strcmp(parent->schema->name, "filter")) {
        /* special case of inserting unqualified filter attributes "type" and "select" */
        module = ly_ctx_get_module(ctx, "ietf-netconf", NULL, 1);
        if (!module) {
            LOGERR(ctx, LY_EINVAL, "Attribute prefix does not match any implemented schema in the context.");
            return NULL;
        }
    } else {
        /* no prefix -> module is the same as for the parent */
        module = lyd_node_module(parent);
    }

    pos = -1;
    do {
        if ((unsigned int)(pos + 1) < module->ext_size) {
            i = lys_ext_instance_presence(&ctx->models.list[0]->extensions[0],
                                          &module->ext[pos + 1], module->ext_size - (pos + 1));
            pos = (i == -1) ? -1 : pos + 1 + i;
        } else {
            pos = -1;
        }
        if (pos == -1) {
            LOGERR(ctx, LY_EINVAL, "Attribute does not match any annotation instance definition.");
            return NULL;
        }
    } while (!ly_strequal(module->ext[pos]->arg_value, name, 0));

    a = calloc(1, sizeof *a);
    LY_CHECK_ERR_RETURN(!a, LOGMEM(ctx), NULL);
    a->parent = parent;
    a->next = NULL;
    a->annotation = (struct lys_ext_instance_complex *)module->ext[pos];
    a->name = lydict_insert(ctx, name, 0);
    a->value_str = lydict_insert(ctx, value, 0);
    if (!lyp_parse_value(*((struct lys_type **)lys_ext_complex_get_substmt(LY_STMT_TYPE, a->annotation, NULL)),
                         &a->value_str, NULL, NULL, a, NULL, 1, 0, 0)) {
        lyd_free_attr(ctx, NULL, a, 0);
        return NULL;
    }

    if (!parent->attr) {
        parent->attr = a;
    } else {
        for (iter = parent->attr; iter->next; iter = iter->next);
        iter->next = a;
    }

    return a;
}